

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
SubcommandProgram_CallbackOrder_Test::TestBody(SubcommandProgram_CallbackOrder_Test *this)

{
  input_t *piVar1;
  char *pcVar2;
  long lVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_d1;
  AssertHelper local_d0;
  AssertionResult gtest_ar;
  _Vector_base<int,_std::allocator<int>_> local_b8;
  string local_98 [32];
  vector<int,_std::allocator<int>_> callback_order;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  callback_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  callback_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  callback_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38._8_8_ = 0;
  local_20 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:635:25)>
             ::_M_invoke;
  local_28 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:635:25)>
             ::_M_manager;
  local_38._M_unused._M_object = &callback_order;
  CLI::std::function<void_()>::operator=
            (&((this->super_SubcommandProgram).start)->callback_,(function<void_()> *)&local_38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_58._8_8_ = 0;
  local_40 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:636:24)>
             ::_M_invoke;
  local_48 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:636:24)>
             ::_M_manager;
  local_58._M_unused._M_object = &callback_order;
  CLI::std::function<void_()>::operator=
            (&((this->super_SubcommandProgram).stop)->callback_,(function<void_()> *)&local_58);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::string((string *)&local_b8,"start",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_98,"stop",(allocator *)&local_d0);
  piVar1 = &(this->super_SubcommandProgram).super_TApp.args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_b8,
             &callback_order);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&local_b8._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  TApp::run((TApp *)this);
  local_d0.data_ = (AssertHelperData *)0x200000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_d0;
  CLI::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_b8,__l,&local_d1);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)&gtest_ar,"callback_order","std::vector<int>({1, 2})",&callback_order,
             (vector<int,_std::allocator<int>_> *)&local_b8);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x280,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  if (callback_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      callback_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    callback_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = callback_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  std::__cxx11::string::string((string *)&local_b8,"stop",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_98,"start",(allocator *)&local_d0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_b8,
             &callback_order);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&local_b8._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  TApp::run((TApp *)this);
  local_d0.data_ = (AssertHelperData *)0x100000002;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_d0;
  CLI::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_b8,__l_00,&local_d1);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)&gtest_ar,"callback_order","std::vector<int>({2, 1})",&callback_order,
             (vector<int,_std::allocator<int>_> *)&local_b8);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x287,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&callback_order.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST_F(SubcommandProgram, CallbackOrder) {
    std::vector<int> callback_order;
    start->set_callback([&callback_order]() { callback_order.push_back(1); });
    stop->set_callback([&callback_order]() { callback_order.push_back(2); });

    args = {"start", "stop"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({1, 2}));

    app.reset();
    callback_order.clear();

    args = {"stop", "start"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({2, 1}));
}